

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maxNodeHeap.h
# Opt level: O0

void __thiscall maxNodeHeap::deleteNode(maxNodeHeap *this,NodeID node)

{
  int iVar1;
  int iVar2;
  mapped_type *pmVar3;
  reference pvVar4;
  reference pvVar5;
  size_type sVar6;
  reference __y;
  reference __b;
  Data *pDVar7;
  NodeID local_20;
  int local_1c;
  int cnode;
  int heap_index;
  int element_index;
  NodeID node_local;
  maxNodeHeap *this_local;
  
  heap_index = node;
  _element_index = this;
  pmVar3 = std::
           unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
           ::operator[](&this->m_element_index,&heap_index);
  cnode = *pmVar3;
  pvVar4 = std::vector<QElement<maxNodeHeap::Data>,_std::allocator<QElement<maxNodeHeap::Data>_>_>::
           operator[](&this->m_elements,(long)cnode);
  local_1c = QElement<maxNodeHeap::Data>::get_index(pvVar4);
  std::
  unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
  ::erase(&this->m_element_index,&heap_index);
  pvVar5 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                     (&this->m_heap,(long)local_1c);
  sVar6 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::size
                    (&this->m_heap);
  __y = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                  (&this->m_heap,sVar6 - 1);
  std::swap<int,int>(pvVar5,__y);
  pvVar5 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                     (&this->m_heap,(long)local_1c);
  pvVar4 = std::vector<QElement<maxNodeHeap::Data>,_std::allocator<QElement<maxNodeHeap::Data>_>_>::
           operator[](&this->m_elements,(long)pvVar5->second);
  QElement<maxNodeHeap::Data>::set_index(pvVar4,local_1c);
  iVar1 = cnode;
  sVar6 = std::vector<QElement<maxNodeHeap::Data>,_std::allocator<QElement<maxNodeHeap::Data>_>_>::
          size(&this->m_elements);
  if (iVar1 != (int)sVar6 + -1) {
    pvVar4 = std::vector<QElement<maxNodeHeap::Data>,_std::allocator<QElement<maxNodeHeap::Data>_>_>
             ::operator[](&this->m_elements,(long)cnode);
    sVar6 = std::vector<QElement<maxNodeHeap::Data>,_std::allocator<QElement<maxNodeHeap::Data>_>_>
            ::size(&this->m_elements);
    __b = std::vector<QElement<maxNodeHeap::Data>,_std::allocator<QElement<maxNodeHeap::Data>_>_>::
          operator[](&this->m_elements,sVar6 - 1);
    std::swap<QElement<maxNodeHeap::Data>>(pvVar4,__b);
    iVar1 = cnode;
    pvVar4 = std::vector<QElement<maxNodeHeap::Data>,_std::allocator<QElement<maxNodeHeap::Data>_>_>
             ::operator[](&this->m_elements,(long)cnode);
    iVar2 = QElement<maxNodeHeap::Data>::get_index(pvVar4);
    pvVar5 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                       (&this->m_heap,(long)iVar2);
    pvVar5->second = iVar1;
    pvVar4 = std::vector<QElement<maxNodeHeap::Data>,_std::allocator<QElement<maxNodeHeap::Data>_>_>
             ::operator[](&this->m_elements,(long)cnode);
    pDVar7 = QElement<maxNodeHeap::Data>::get_data(pvVar4);
    iVar1 = cnode;
    local_20 = pDVar7->node;
    pmVar3 = std::
             unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
             ::operator[](&this->m_element_index,&local_20);
    *pmVar3 = iVar1;
  }
  std::vector<QElement<maxNodeHeap::Data>,_std::allocator<QElement<maxNodeHeap::Data>_>_>::pop_back
            (&this->m_elements);
  std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::pop_back(&this->m_heap);
  sVar6 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::size
                    (&this->m_heap);
  iVar1 = local_1c;
  if (1 < sVar6) {
    sVar6 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::size
                      (&this->m_heap);
    if (iVar1 < (int)sVar6) {
      siftDown(this,local_1c);
      siftUp(this,local_1c);
    }
  }
  return;
}

Assistant:

inline void maxNodeHeap::deleteNode(NodeID node) {
        int element_index = m_element_index[node];
        int heap_index    = m_elements[element_index].get_index();

        m_element_index.erase(node);

        std::swap( m_heap[heap_index], m_heap[m_heap.size() - 1]);
        //update the position of its element in the element array
        m_elements[m_heap[heap_index].second].set_index(heap_index);

        // we dont want holes in the elements array -- delete the deleted element from the array
        if(element_index != (int)(m_elements.size() - 1)) {
                std::swap( m_elements[element_index], m_elements[m_elements.size() - 1]);
                m_heap[ m_elements[element_index].get_index() ].second = element_index;
                int cnode              = m_elements[element_index].get_data().node;
                m_element_index[cnode] = element_index;
        }

        m_elements.pop_back();
        m_heap.pop_back();

        if( m_heap.size() > 1 && heap_index < (int)m_heap.size() ) {
                //fix the max heap property
                siftDown(heap_index);
                siftUp(heap_index);
        }
}